

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

ParseStatus ParseVP8X(WebPDemuxer *dmux)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  MemBuffer_conflict *in_RDI;
  uint32_t vp8x_size;
  MemBuffer_conflict *mem;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  ParseStatus local_4;
  
  sVar5 = MemDataSize(in_RDI);
  if (sVar5 < 8) {
    local_4 = PARSE_NEED_MORE_DATA;
  }
  else {
    *(undefined4 *)((long)&in_RDI[1].start_ + 4) = 1;
    Skip(in_RDI,4);
    uVar2 = ReadLE32((MemBuffer_conflict *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (uVar2 < 0xfffffff7) {
      if (uVar2 < 10) {
        local_4 = PARSE_ERROR;
      }
      else {
        uVar3 = (uVar2 & 1) + uVar2;
        iVar4 = SizeIsInvalid(in_RDI,(ulong)uVar3);
        if (iVar4 == 0) {
          sVar5 = MemDataSize(in_RDI);
          if (sVar5 < uVar3) {
            local_4 = PARSE_NEED_MORE_DATA;
          }
          else {
            bVar1 = ReadByte((MemBuffer_conflict *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
            *(uint *)&in_RDI[1].end_ = (uint)bVar1;
            Skip(in_RDI,3);
            iVar4 = ReadLE24s((MemBuffer_conflict *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
            *(int *)((long)&in_RDI[1].end_ + 4) = iVar4 + 1;
            iVar4 = ReadLE24s((MemBuffer_conflict *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
            *(int *)&in_RDI[1].riff_end_ = iVar4 + 1;
            if ((ulong)((long)*(int *)((long)&in_RDI[1].end_ + 4) * (long)(int)in_RDI[1].riff_end_)
                < 0x100000000) {
              Skip(in_RDI,(ulong)(uVar3 - 10));
              *(undefined4 *)&in_RDI[1].start_ = 1;
              iVar4 = SizeIsInvalid(in_RDI,8);
              if (iVar4 == 0) {
                sVar5 = MemDataSize(in_RDI);
                if (sVar5 < 8) {
                  local_4 = PARSE_NEED_MORE_DATA;
                }
                else {
                  local_4 = ParseVP8XChunks(dmux);
                }
              }
              else {
                local_4 = PARSE_ERROR;
              }
            }
            else {
              local_4 = PARSE_ERROR;
            }
          }
        }
        else {
          local_4 = PARSE_ERROR;
        }
      }
    }
    else {
      local_4 = PARSE_ERROR;
    }
  }
  return local_4;
}

Assistant:

static ParseStatus ParseVP8X(WebPDemuxer* const dmux) {
  MemBuffer* const mem = &dmux->mem_;
  uint32_t vp8x_size;

  if (MemDataSize(mem) < CHUNK_HEADER_SIZE) return PARSE_NEED_MORE_DATA;

  dmux->is_ext_format_ = 1;
  Skip(mem, TAG_SIZE);  // VP8X
  vp8x_size = ReadLE32(mem);
  if (vp8x_size > MAX_CHUNK_PAYLOAD) return PARSE_ERROR;
  if (vp8x_size < VP8X_CHUNK_SIZE) return PARSE_ERROR;
  vp8x_size += vp8x_size & 1;
  if (SizeIsInvalid(mem, vp8x_size)) return PARSE_ERROR;
  if (MemDataSize(mem) < vp8x_size) return PARSE_NEED_MORE_DATA;

  dmux->feature_flags_ = ReadByte(mem);
  Skip(mem, 3);  // Reserved.
  dmux->canvas_width_  = 1 + ReadLE24s(mem);
  dmux->canvas_height_ = 1 + ReadLE24s(mem);
  if (dmux->canvas_width_ * (uint64_t)dmux->canvas_height_ >= MAX_IMAGE_AREA) {
    return PARSE_ERROR;  // image final dimension is too large
  }
  Skip(mem, vp8x_size - VP8X_CHUNK_SIZE);  // skip any trailing data.
  dmux->state_ = WEBP_DEMUX_PARSED_HEADER;

  if (SizeIsInvalid(mem, CHUNK_HEADER_SIZE)) return PARSE_ERROR;
  if (MemDataSize(mem) < CHUNK_HEADER_SIZE) return PARSE_NEED_MORE_DATA;

  return ParseVP8XChunks(dmux);
}